

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O0

void __thiscall flatbuffers::ToStringVisitor::Long(ToStringVisitor *this,int64_t x)

{
  string local_38;
  int64_t local_18;
  int64_t x_local;
  ToStringVisitor *this_local;
  
  local_18 = x;
  x_local = (int64_t)this;
  NumToString<long>(&local_38,x);
  std::__cxx11::string::operator+=((string *)&this->s,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Long(int64_t x) { s += NumToString(x); }